

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

bool __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<bool>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  undefined8 __s;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  string value;
  char *name_local;
  OgreXmlSerializer *this_local;
  
  value.field_2._8_8_ = name;
  ReadAttribute<std::__cxx11::string>(&local_60,this,name);
  ToLower((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"true",&local_91);
  iVar1 = ASSIMP_stricmp((string *)local_40,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if (iVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"false",&local_b9);
    iVar1 = ASSIMP_stricmp((string *)local_40,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    __s = value.field_2._8_8_;
    if (iVar1 != 0) {
      reader = this->m_reader;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,(char *)__s,&local_e1);
      std::operator+(&local_128,
                     "Boolean value is expected to be \'true\' or \'false\', encountered \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_108,&local_128,"\'");
      ThrowAttibuteError(reader,&local_e0,&local_108);
    }
    this_local._7_1_ = false;
  }
  local_98 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool OgreXmlSerializer::ReadAttribute<bool>(const char *name) const
{
    std::string value = Ogre::ToLower(ReadAttribute<std::string>(name));
    if (ASSIMP_stricmp(value, "true") == 0)
    {
        return true;
    }
    else if (ASSIMP_stricmp(value, "false") == 0)
    {
        return false;
    }
    else
    {
        ThrowAttibuteError(m_reader, name, "Boolean value is expected to be 'true' or 'false', encountered '" + value + "'");
        return false;
    }
}